

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void h2v2_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  int iVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  JSAMPLE *pJVar4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var5;
  long lVar6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var8;
  jpeg_error_mgr **ppjVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  JSAMPROW outptr0;
  int cr;
  int cb;
  int cblue;
  int cgreen;
  int cred;
  int y;
  my_merged_upsample_ptr upsample;
  JLONG *Cbgtab_1;
  JLONG *Crgtab_1;
  int *Cbbtab_1;
  int *Crrtab_1;
  JSAMPLE *range_limit_1;
  JDIMENSION col_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr01_1;
  JSAMPROW inptr00_1;
  JSAMPROW outptr1_1;
  JSAMPROW outptr0_1;
  int cr_1;
  int cb_1;
  int cblue_1;
  int cgreen_1;
  int cred_1;
  int y_1;
  my_merged_upsample_ptr upsample_1;
  JLONG *Cbgtab_2;
  JLONG *Crgtab_2;
  int *Cbbtab_2;
  int *Crrtab_2;
  JSAMPLE *range_limit_2;
  JDIMENSION col_2;
  JSAMPROW inptr2_2;
  JSAMPROW inptr1_2;
  JSAMPROW inptr01_2;
  JSAMPROW inptr00_2;
  JSAMPROW outptr1_2;
  JSAMPROW outptr0_2;
  int cr_2;
  int cb_2;
  int cblue_2;
  int cgreen_2;
  int cred_2;
  int y_2;
  my_merged_upsample_ptr upsample_2;
  JLONG *Cbgtab_3;
  JLONG *Crgtab_3;
  int *Cbbtab_3;
  int *Crrtab_3;
  JSAMPLE *range_limit_3;
  JDIMENSION col_3;
  JSAMPROW inptr2_3;
  JSAMPROW inptr1_3;
  JSAMPROW inptr01_3;
  JSAMPROW inptr00_3;
  JSAMPROW outptr1_3;
  JSAMPROW outptr0_3;
  int cr_3;
  int cb_3;
  int cblue_3;
  int cgreen_3;
  int cred_3;
  int y_3;
  my_merged_upsample_ptr upsample_3;
  JLONG *Cbgtab_4;
  JLONG *Crgtab_4;
  int *Cbbtab_4;
  int *Crrtab_4;
  JSAMPLE *range_limit_4;
  JDIMENSION col_4;
  JSAMPROW inptr2_4;
  JSAMPROW inptr1_4;
  JSAMPROW inptr01_4;
  JSAMPROW inptr00_4;
  JSAMPROW outptr1_4;
  JSAMPROW outptr0_4;
  int cr_4;
  int cb_4;
  int cblue_4;
  int cgreen_4;
  int cred_4;
  int y_4;
  my_merged_upsample_ptr upsample_4;
  JLONG *Cbgtab_5;
  JLONG *Crgtab_5;
  int *Cbbtab_5;
  int *Crrtab_5;
  JSAMPLE *range_limit_5;
  JDIMENSION col_5;
  JSAMPROW inptr2_5;
  JSAMPROW inptr1_5;
  JSAMPROW inptr01_5;
  JSAMPROW inptr00_5;
  JSAMPROW outptr1_5;
  JSAMPROW outptr0_5;
  int cr_5;
  int cb_5;
  int cblue_5;
  int cgreen_5;
  int cred_5;
  int y_5;
  my_merged_upsample_ptr upsample_5;
  JLONG *Cbgtab_6;
  JLONG *Crgtab_6;
  int *Cbbtab_6;
  int *Crrtab_6;
  JSAMPLE *range_limit_6;
  JDIMENSION col_6;
  JSAMPROW inptr2_6;
  JSAMPROW inptr1_6;
  JSAMPROW inptr01_6;
  JSAMPROW inptr00_6;
  JSAMPROW outptr1_6;
  JSAMPROW outptr0_6;
  int cr_6;
  int cb_6;
  int cblue_6;
  int cgreen_6;
  int cred_6;
  int y_6;
  my_merged_upsample_ptr upsample_6;
  uint local_434;
  byte *local_430;
  byte *local_428;
  byte *local_420;
  byte *local_418;
  JSAMPROW local_410;
  JSAMPROW local_408;
  uint local_394;
  byte *local_390;
  byte *local_388;
  byte *local_380;
  byte *local_378;
  JSAMPROW local_370;
  JSAMPROW local_368;
  uint local_2f4;
  byte *local_2f0;
  byte *local_2e8;
  byte *local_2e0;
  byte *local_2d8;
  JSAMPROW local_2d0;
  JSAMPROW local_2c8;
  uint local_254;
  byte *local_250;
  byte *local_248;
  byte *local_240;
  byte *local_238;
  JSAMPROW local_230;
  JSAMPROW local_228;
  uint local_1b4;
  byte *local_1b0;
  byte *local_1a8;
  byte *local_1a0;
  byte *local_198;
  JSAMPROW local_190;
  JSAMPROW local_188;
  uint local_114;
  byte *local_110;
  byte *local_108;
  byte *local_100;
  byte *local_f8;
  JSAMPROW local_f0;
  JSAMPROW local_e8;
  JSAMPARRAY output_buf_local;
  byte *pbStack_70;
  JDIMENSION in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  JLONG *Cbgtab;
  JLONG *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr01;
  JSAMPROW inptr00;
  JSAMPROW outptr1;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_418 = (*input_buf)[in_row_group_ctr << 1];
    local_420 = (*input_buf)[in_row_group_ctr * 2 + 1];
    local_408 = *output_buf;
    local_410 = output_buf[1];
    local_430 = input_buf[2][in_row_group_ctr];
    local_428 = input_buf[1][in_row_group_ctr];
    for (local_434 = cinfo->output_width >> 1; local_434 != 0; local_434 = local_434 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_430 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_428 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_430 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_428 * 4);
      pbVar12 = local_418 + 1;
      uVar11 = (uint)*local_418;
      *local_408 = pJVar4[(int)(uVar11 + iVar1)];
      local_408[1] = pJVar4[(int)(uVar11 + iVar10)];
      local_408[2] = pJVar4[(int)(uVar11 + iVar2)];
      local_418 = local_418 + 2;
      uVar11 = (uint)*pbVar12;
      local_408[3] = pJVar4[(int)(uVar11 + iVar1)];
      local_408[4] = pJVar4[(int)(uVar11 + iVar10)];
      local_408[5] = pJVar4[(int)(uVar11 + iVar2)];
      local_408 = local_408 + 6;
      pbVar12 = local_420 + 1;
      uVar11 = (uint)*local_420;
      *local_410 = pJVar4[(int)(uVar11 + iVar1)];
      local_410[1] = pJVar4[(int)(uVar11 + iVar10)];
      local_410[2] = pJVar4[(int)(uVar11 + iVar2)];
      local_420 = local_420 + 2;
      uVar11 = (uint)*pbVar12;
      local_410[3] = pJVar4[(int)(uVar11 + iVar1)];
      local_410[4] = pJVar4[(int)(uVar11 + iVar10)];
      local_410[5] = pJVar4[(int)(uVar11 + iVar2)];
      local_410 = local_410 + 6;
      local_430 = local_430 + 1;
      local_428 = local_428 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_430 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_428 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_430 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_428 * 4);
      uVar11 = (uint)*local_418;
      *local_408 = pJVar4[(int)(uVar11 + iVar1)];
      local_408[1] = pJVar4[(int)(uVar11 + iVar10)];
      local_408[2] = pJVar4[(int)(uVar11 + iVar2)];
      uVar11 = (uint)*local_420;
      *local_410 = pJVar4[(int)(uVar11 + iVar1)];
      local_410[1] = pJVar4[(int)(uVar11 + iVar10)];
      local_410[2] = pJVar4[(int)(uVar11 + iVar2)];
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_378 = (*input_buf)[in_row_group_ctr << 1];
    local_380 = (*input_buf)[in_row_group_ctr * 2 + 1];
    local_368 = *output_buf;
    local_370 = output_buf[1];
    local_390 = input_buf[2][in_row_group_ctr];
    local_388 = input_buf[1][in_row_group_ctr];
    for (local_394 = cinfo->output_width >> 1; local_394 != 0; local_394 = local_394 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_390 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_388 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_390 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_388 * 4);
      pbVar12 = local_378 + 1;
      uVar11 = (uint)*local_378;
      *local_368 = pJVar4[(int)(uVar11 + iVar1)];
      local_368[1] = pJVar4[(int)(uVar11 + iVar10)];
      local_368[2] = pJVar4[(int)(uVar11 + iVar2)];
      local_368[3] = 0xff;
      local_378 = local_378 + 2;
      uVar11 = (uint)*pbVar12;
      local_368[4] = pJVar4[(int)(uVar11 + iVar1)];
      local_368[5] = pJVar4[(int)(uVar11 + iVar10)];
      local_368[6] = pJVar4[(int)(uVar11 + iVar2)];
      local_368[7] = 0xff;
      local_368 = local_368 + 8;
      pbVar12 = local_380 + 1;
      uVar11 = (uint)*local_380;
      *local_370 = pJVar4[(int)(uVar11 + iVar1)];
      local_370[1] = pJVar4[(int)(uVar11 + iVar10)];
      local_370[2] = pJVar4[(int)(uVar11 + iVar2)];
      local_370[3] = 0xff;
      local_380 = local_380 + 2;
      uVar11 = (uint)*pbVar12;
      local_370[4] = pJVar4[(int)(uVar11 + iVar1)];
      local_370[5] = pJVar4[(int)(uVar11 + iVar10)];
      local_370[6] = pJVar4[(int)(uVar11 + iVar2)];
      local_370[7] = 0xff;
      local_370 = local_370 + 8;
      local_390 = local_390 + 1;
      local_388 = local_388 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_390 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_388 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_390 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_388 * 4);
      uVar11 = (uint)*local_378;
      *local_368 = pJVar4[(int)(uVar11 + iVar1)];
      local_368[1] = pJVar4[(int)(uVar11 + iVar10)];
      local_368[2] = pJVar4[(int)(uVar11 + iVar2)];
      local_368[3] = 0xff;
      uVar11 = (uint)*local_380;
      *local_370 = pJVar4[(int)(uVar11 + iVar1)];
      local_370[1] = pJVar4[(int)(uVar11 + iVar10)];
      local_370[2] = pJVar4[(int)(uVar11 + iVar2)];
      local_370[3] = 0xff;
    }
    break;
  case JCS_EXT_BGR:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_2d8 = (*input_buf)[in_row_group_ctr << 1];
    local_2e0 = (*input_buf)[in_row_group_ctr * 2 + 1];
    local_2c8 = *output_buf;
    local_2d0 = output_buf[1];
    local_2f0 = input_buf[2][in_row_group_ctr];
    local_2e8 = input_buf[1][in_row_group_ctr];
    for (local_2f4 = cinfo->output_width >> 1; local_2f4 != 0; local_2f4 = local_2f4 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_2f0 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_2e8 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_2f0 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_2e8 * 4);
      pbVar12 = local_2d8 + 1;
      uVar11 = (uint)*local_2d8;
      local_2c8[2] = pJVar4[(int)(uVar11 + iVar1)];
      local_2c8[1] = pJVar4[(int)(uVar11 + iVar10)];
      *local_2c8 = pJVar4[(int)(uVar11 + iVar2)];
      local_2d8 = local_2d8 + 2;
      uVar11 = (uint)*pbVar12;
      local_2c8[5] = pJVar4[(int)(uVar11 + iVar1)];
      local_2c8[4] = pJVar4[(int)(uVar11 + iVar10)];
      local_2c8[3] = pJVar4[(int)(uVar11 + iVar2)];
      local_2c8 = local_2c8 + 6;
      pbVar12 = local_2e0 + 1;
      uVar11 = (uint)*local_2e0;
      local_2d0[2] = pJVar4[(int)(uVar11 + iVar1)];
      local_2d0[1] = pJVar4[(int)(uVar11 + iVar10)];
      *local_2d0 = pJVar4[(int)(uVar11 + iVar2)];
      local_2e0 = local_2e0 + 2;
      uVar11 = (uint)*pbVar12;
      local_2d0[5] = pJVar4[(int)(uVar11 + iVar1)];
      local_2d0[4] = pJVar4[(int)(uVar11 + iVar10)];
      local_2d0[3] = pJVar4[(int)(uVar11 + iVar2)];
      local_2d0 = local_2d0 + 6;
      local_2f0 = local_2f0 + 1;
      local_2e8 = local_2e8 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_2f0 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_2e8 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_2f0 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_2e8 * 4);
      uVar11 = (uint)*local_2d8;
      local_2c8[2] = pJVar4[(int)(uVar11 + iVar1)];
      local_2c8[1] = pJVar4[(int)(uVar11 + iVar10)];
      *local_2c8 = pJVar4[(int)(uVar11 + iVar2)];
      uVar11 = (uint)*local_2e0;
      local_2d0[2] = pJVar4[(int)(uVar11 + iVar1)];
      local_2d0[1] = pJVar4[(int)(uVar11 + iVar10)];
      *local_2d0 = pJVar4[(int)(uVar11 + iVar2)];
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_238 = (*input_buf)[in_row_group_ctr << 1];
    local_240 = (*input_buf)[in_row_group_ctr * 2 + 1];
    local_228 = *output_buf;
    local_230 = output_buf[1];
    local_250 = input_buf[2][in_row_group_ctr];
    local_248 = input_buf[1][in_row_group_ctr];
    for (local_254 = cinfo->output_width >> 1; local_254 != 0; local_254 = local_254 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_250 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_248 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_250 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_248 * 4);
      pbVar12 = local_238 + 1;
      uVar11 = (uint)*local_238;
      local_228[2] = pJVar4[(int)(uVar11 + iVar1)];
      local_228[1] = pJVar4[(int)(uVar11 + iVar10)];
      *local_228 = pJVar4[(int)(uVar11 + iVar2)];
      local_228[3] = 0xff;
      local_238 = local_238 + 2;
      uVar11 = (uint)*pbVar12;
      local_228[6] = pJVar4[(int)(uVar11 + iVar1)];
      local_228[5] = pJVar4[(int)(uVar11 + iVar10)];
      local_228[4] = pJVar4[(int)(uVar11 + iVar2)];
      local_228[7] = 0xff;
      local_228 = local_228 + 8;
      pbVar12 = local_240 + 1;
      uVar11 = (uint)*local_240;
      local_230[2] = pJVar4[(int)(uVar11 + iVar1)];
      local_230[1] = pJVar4[(int)(uVar11 + iVar10)];
      *local_230 = pJVar4[(int)(uVar11 + iVar2)];
      local_230[3] = 0xff;
      local_240 = local_240 + 2;
      uVar11 = (uint)*pbVar12;
      local_230[6] = pJVar4[(int)(uVar11 + iVar1)];
      local_230[5] = pJVar4[(int)(uVar11 + iVar10)];
      local_230[4] = pJVar4[(int)(uVar11 + iVar2)];
      local_230[7] = 0xff;
      local_230 = local_230 + 8;
      local_250 = local_250 + 1;
      local_248 = local_248 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_250 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_248 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_250 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_248 * 4);
      uVar11 = (uint)*local_238;
      local_228[2] = pJVar4[(int)(uVar11 + iVar1)];
      local_228[1] = pJVar4[(int)(uVar11 + iVar10)];
      *local_228 = pJVar4[(int)(uVar11 + iVar2)];
      local_228[3] = 0xff;
      uVar11 = (uint)*local_240;
      local_230[2] = pJVar4[(int)(uVar11 + iVar1)];
      local_230[1] = pJVar4[(int)(uVar11 + iVar10)];
      *local_230 = pJVar4[(int)(uVar11 + iVar2)];
      local_230[3] = 0xff;
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_198 = (*input_buf)[in_row_group_ctr << 1];
    local_1a0 = (*input_buf)[in_row_group_ctr * 2 + 1];
    local_188 = *output_buf;
    local_190 = output_buf[1];
    local_1b0 = input_buf[2][in_row_group_ctr];
    local_1a8 = input_buf[1][in_row_group_ctr];
    for (local_1b4 = cinfo->output_width >> 1; local_1b4 != 0; local_1b4 = local_1b4 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_1b0 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_1a8 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_1b0 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_1a8 * 4);
      pbVar12 = local_198 + 1;
      uVar11 = (uint)*local_198;
      local_188[3] = pJVar4[(int)(uVar11 + iVar1)];
      local_188[2] = pJVar4[(int)(uVar11 + iVar10)];
      local_188[1] = pJVar4[(int)(uVar11 + iVar2)];
      *local_188 = 0xff;
      local_198 = local_198 + 2;
      uVar11 = (uint)*pbVar12;
      local_188[7] = pJVar4[(int)(uVar11 + iVar1)];
      local_188[6] = pJVar4[(int)(uVar11 + iVar10)];
      local_188[5] = pJVar4[(int)(uVar11 + iVar2)];
      local_188[4] = 0xff;
      local_188 = local_188 + 8;
      pbVar12 = local_1a0 + 1;
      uVar11 = (uint)*local_1a0;
      local_190[3] = pJVar4[(int)(uVar11 + iVar1)];
      local_190[2] = pJVar4[(int)(uVar11 + iVar10)];
      local_190[1] = pJVar4[(int)(uVar11 + iVar2)];
      *local_190 = 0xff;
      local_1a0 = local_1a0 + 2;
      uVar11 = (uint)*pbVar12;
      local_190[7] = pJVar4[(int)(uVar11 + iVar1)];
      local_190[6] = pJVar4[(int)(uVar11 + iVar10)];
      local_190[5] = pJVar4[(int)(uVar11 + iVar2)];
      local_190[4] = 0xff;
      local_190 = local_190 + 8;
      local_1b0 = local_1b0 + 1;
      local_1a8 = local_1a8 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_1b0 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_1a8 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_1b0 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_1a8 * 4);
      uVar11 = (uint)*local_198;
      local_188[3] = pJVar4[(int)(uVar11 + iVar1)];
      local_188[2] = pJVar4[(int)(uVar11 + iVar10)];
      local_188[1] = pJVar4[(int)(uVar11 + iVar2)];
      *local_188 = 0xff;
      uVar11 = (uint)*local_1a0;
      local_190[3] = pJVar4[(int)(uVar11 + iVar1)];
      local_190[2] = pJVar4[(int)(uVar11 + iVar10)];
      local_190[1] = pJVar4[(int)(uVar11 + iVar2)];
      *local_190 = 0xff;
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_f8 = (*input_buf)[in_row_group_ctr << 1];
    local_100 = (*input_buf)[in_row_group_ctr * 2 + 1];
    local_e8 = *output_buf;
    local_f0 = output_buf[1];
    local_110 = input_buf[2][in_row_group_ctr];
    local_108 = input_buf[1][in_row_group_ctr];
    for (local_114 = cinfo->output_width >> 1; local_114 != 0; local_114 = local_114 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_110 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_108 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_110 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_108 * 4);
      pbVar12 = local_f8 + 1;
      uVar11 = (uint)*local_f8;
      local_e8[1] = pJVar4[(int)(uVar11 + iVar1)];
      local_e8[2] = pJVar4[(int)(uVar11 + iVar10)];
      local_e8[3] = pJVar4[(int)(uVar11 + iVar2)];
      *local_e8 = 0xff;
      local_f8 = local_f8 + 2;
      uVar11 = (uint)*pbVar12;
      local_e8[5] = pJVar4[(int)(uVar11 + iVar1)];
      local_e8[6] = pJVar4[(int)(uVar11 + iVar10)];
      local_e8[7] = pJVar4[(int)(uVar11 + iVar2)];
      local_e8[4] = 0xff;
      local_e8 = local_e8 + 8;
      pbVar12 = local_100 + 1;
      uVar11 = (uint)*local_100;
      local_f0[1] = pJVar4[(int)(uVar11 + iVar1)];
      local_f0[2] = pJVar4[(int)(uVar11 + iVar10)];
      local_f0[3] = pJVar4[(int)(uVar11 + iVar2)];
      *local_f0 = 0xff;
      local_100 = local_100 + 2;
      uVar11 = (uint)*pbVar12;
      local_f0[5] = pJVar4[(int)(uVar11 + iVar1)];
      local_f0[6] = pJVar4[(int)(uVar11 + iVar10)];
      local_f0[7] = pJVar4[(int)(uVar11 + iVar2)];
      local_f0[4] = 0xff;
      local_f0 = local_f0 + 8;
      local_110 = local_110 + 1;
      local_108 = local_108 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_110 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_108 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_110 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_108 * 4);
      uVar11 = (uint)*local_f8;
      local_e8[1] = pJVar4[(int)(uVar11 + iVar1)];
      local_e8[2] = pJVar4[(int)(uVar11 + iVar10)];
      local_e8[3] = pJVar4[(int)(uVar11 + iVar2)];
      *local_e8 = 0xff;
      uVar11 = (uint)*local_100;
      local_f0[1] = pJVar4[(int)(uVar11 + iVar1)];
      local_f0[2] = pJVar4[(int)(uVar11 + iVar10)];
      local_f0[3] = pJVar4[(int)(uVar11 + iVar2)];
      *local_f0 = 0xff;
    }
    break;
  default:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    Cbgtab = (JLONG *)(*input_buf)[in_row_group_ctr << 1];
    cinfo_local = (j_decompress_ptr)(*input_buf)[in_row_group_ctr * 2 + 1];
    Cbbtab = (int *)*output_buf;
    Crgtab = (JLONG *)output_buf[1];
    pbStack_70 = input_buf[2][in_row_group_ctr];
    input_buf_local = (JSAMPIMAGE)input_buf[1][in_row_group_ctr];
    for (output_buf_local._4_4_ = cinfo->output_width >> 1; output_buf_local._4_4_ != 0;
        output_buf_local._4_4_ = output_buf_local._4_4_ - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*pbStack_70 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*(byte *)input_buf_local * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*pbStack_70 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*(byte *)input_buf_local * 4);
      pbVar12 = (byte *)((long)Cbgtab + 1);
      uVar11 = (uint)(byte)*Cbgtab;
      *(JSAMPLE *)Cbbtab = pJVar4[(int)(uVar11 + iVar1)];
      *(JSAMPLE *)((long)Cbbtab + 1) = pJVar4[(int)(uVar11 + iVar10)];
      *(JSAMPLE *)((long)Cbbtab + 2) = pJVar4[(int)(uVar11 + iVar2)];
      Cbgtab = (JLONG *)((long)Cbgtab + 2);
      uVar11 = (uint)*pbVar12;
      *(JSAMPLE *)((long)Cbbtab + 3) = pJVar4[(int)(uVar11 + iVar1)];
      *(JSAMPLE *)(Cbbtab + 1) = pJVar4[(int)(uVar11 + iVar10)];
      *(JSAMPLE *)((long)Cbbtab + 5) = pJVar4[(int)(uVar11 + iVar2)];
      Cbbtab = (int *)((long)Cbbtab + 6);
      ppjVar9 = &cinfo_local->err;
      uVar11 = (uint)*(byte *)&cinfo_local->err;
      *(JSAMPLE *)Crgtab = pJVar4[(int)(uVar11 + iVar1)];
      *(JSAMPLE *)((long)Crgtab + 1) = pJVar4[(int)(uVar11 + iVar10)];
      *(JSAMPLE *)((long)Crgtab + 2) = pJVar4[(int)(uVar11 + iVar2)];
      cinfo_local = (j_decompress_ptr)((long)&cinfo_local->err + 2);
      uVar11 = (uint)*(byte *)((long)ppjVar9 + 1);
      *(JSAMPLE *)((long)Crgtab + 3) = pJVar4[(int)(uVar11 + iVar1)];
      *(JSAMPLE *)((long)Crgtab + 4) = pJVar4[(int)(uVar11 + iVar10)];
      *(JSAMPLE *)((long)Crgtab + 5) = pJVar4[(int)(uVar11 + iVar2)];
      Crgtab = (JLONG *)((long)Crgtab + 6);
      pbStack_70 = pbStack_70 + 1;
      input_buf_local = (JSAMPIMAGE)((long)input_buf_local + 1);
    }
    if ((cinfo->output_width & 1) != 0) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*pbStack_70 * 4);
      iVar10 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*(byte *)input_buf_local * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*pbStack_70 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*(byte *)input_buf_local * 4);
      uVar11 = (uint)(byte)*Cbgtab;
      *(JSAMPLE *)Cbbtab = pJVar4[(int)(uVar11 + iVar1)];
      *(JSAMPLE *)((long)Cbbtab + 1) = pJVar4[(int)(uVar11 + iVar10)];
      *(JSAMPLE *)((long)Cbbtab + 2) = pJVar4[(int)(uVar11 + iVar2)];
      uVar11 = (uint)*(byte *)&cinfo_local->err;
      *(JSAMPLE *)Crgtab = pJVar4[(int)(uVar11 + iVar1)];
      *(JSAMPLE *)((long)Crgtab + 1) = pJVar4[(int)(uVar11 + iVar10)];
      *(JSAMPLE *)((long)Crgtab + 2) = pJVar4[(int)(uVar11 + iVar2)];
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    extrgb_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_BGR:
    extbgr_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  default:
    h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                  output_buf);
    break;
  }
}